

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

Comment * soul::SourceCodeUtilities::parseComment(Comment *__return_storage_ptr__,CodeLocation *pos)

{
  UTF8Reader *this;
  char cVar1;
  byte bVar2;
  text *ptVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  UnicodeChar UVar7;
  iterator __begin3;
  text *ptVar8;
  undefined8 *puVar9;
  text **pptVar10;
  undefined8 uVar11;
  SourceCodeText *pSVar12;
  SourceCodeText *pSVar13;
  pointer pcVar14;
  uint uVar15;
  long lVar16;
  SourceCodeText *pSVar17;
  undefined1 in_R9B;
  ulong uVar18;
  undefined8 uVar19;
  iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t leastLeadingSpace;
  pointer pcVar20;
  string_view source;
  UTF8Reader t;
  Comment result;
  UTF8Reader closeComment;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined2 local_130;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  UTF8Reader local_f8;
  Comment *local_f0;
  SourceCodeText *local_e8;
  text *local_e0;
  undefined1 local_d8 [16];
  SourceCodeText *local_c8;
  undefined1 local_c0 [16];
  _Alloc_hider _Stack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  undefined8 *local_68;
  undefined8 local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pSVar17 = (pos->sourceCode).object;
  if ((pSVar17 == (SourceCodeText *)0x0) || ((pSVar17->content)._M_string_length == 0)) {
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->lines).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).start.location.data = (char *)0x0;
    (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
    (__return_storage_ptr__->range).end.location.data = (char *)0x0;
    return __return_storage_ptr__;
  }
  _local_130 = 0;
  local_128._M_allocated_capacity = 0;
  local_128._8_8_ = (SourceCodeText *)0x0;
  local_118._M_allocated_capacity = 0;
  local_118._8_8_ = (SourceCodeText *)0x0;
  local_108._M_allocated_capacity = 0;
  local_108._8_8_ = (SourceCodeText *)0x0;
  local_f8.data = (char *)0x0;
  this = &pos->location;
  local_150._0_8_ = (pos->location).data;
  while ((uVar5 = local_118._8_8_, (byte)*(string *)local_150._0_8_ - 9 < 5 ||
         (*(string *)local_150._0_8_ == (string)0x20))) {
    UTF8Reader::operator++((UTF8Reader *)local_150);
  }
  (pos->location).data = (char *)local_150._0_8_;
  local_118._8_8_ = (pos->sourceCode).object;
  if ((SourceCodeText *)local_118._8_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_118._8_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_118._8_8_)->super_RefCountedObject).refCount + 1;
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar5);
  local_108._M_allocated_capacity = (size_type)this->data;
  bVar6 = UTF8Reader::advanceIfStartsWith(this,"/*");
  if (bVar6) {
    local_130 = 0x101;
    while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x2a) {
      uStack_12e = 1;
      UTF8Reader::operator++(this);
    }
  }
  else {
    bVar6 = UTF8Reader::advanceIfStartsWith(this,"//");
    if (!bVar6) {
      __return_storage_ptr__->valid = false;
      __return_storage_ptr__->isStarSlash = false;
      __return_storage_ptr__->isDoxygenStyle = false;
      __return_storage_ptr__->isReferringBackwards = false;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
      (__return_storage_ptr__->range).start.location.data = (char *)0x0;
      (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
      (__return_storage_ptr__->range).end.location.data = (char *)0x0;
      goto LAB_001b505d;
    }
    local_130 = 1;
    while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x2f) {
      uStack_12e = 1;
      UTF8Reader::operator++(this);
    }
  }
  bVar6 = UTF8Reader::advanceIfStartsWith(this,"<");
  if (bVar6) {
    uStack_12d = 1;
  }
  while (UVar7 = UTF8Reader::operator*(this), UVar7 == 0x20) {
    UTF8Reader::operator++(this);
  }
  local_98._24_8_ = pos;
  if (local_130._1_1_ == '\0') {
    local_f0 = __return_storage_ptr__;
    do {
      uVar5 = local_98._24_8_;
      CodeLocation::getSourceLine_abi_cxx11_((string *)&local_68,(CodeLocation *)local_98._24_8_);
      pos = (CodeLocation *)&local_68;
      choc::text::trim((string *)local_150,(string *)&local_68);
      if (local_68 != local_58) {
        pos = (CodeLocation *)(local_58[0] + 1);
        operator_delete(local_68,(ulong)pos);
      }
      if (((ulong)local_150._8_8_ < (text *)0x2) || (*(short *)local_150._0_8_ != 0x2f2f)) {
        bVar6 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_150);
        while( true ) {
          std::__cxx11::string::operator=((string *)local_150,(string *)local_a8);
          if ((SourceCodeText *)local_a8._0_8_ != (SourceCodeText *)local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
          }
          if (((text *)local_150._8_8_ == (text *)0x0) ||
             (*(string *)local_150._0_8_ != (string)0x2f)) break;
          std::__cxx11::string::substr((ulong)local_a8,(ulong)local_150);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128,(string *)local_150);
        pos = (CodeLocation *)uVar5;
        CodeLocation::getStartOfNextLine((CodeLocation *)local_a8);
        pSVar17 = *(SourceCodeText **)uVar5;
        if ((SourceCodeText *)local_a8._0_8_ != pSVar17) {
          *(undefined8 *)uVar5 = local_a8._0_8_;
          local_a8._0_8_ = (SourceCodeText *)0x0;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar17);
        }
        this->data = (char *)local_a8._8_8_;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_a8._0_8_);
        bVar6 = true;
      }
      if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
        pos = (CodeLocation *)(local_140._0_8_ + 1);
        operator_delete((void *)local_150._0_8_,(ulong)pos);
      }
      __return_storage_ptr__ = local_f0;
      uVar5 = local_108._8_8_;
    } while (bVar6);
    local_108._8_8_ = *(undefined8 *)local_98._24_8_;
    if ((SourceCodeText *)local_108._8_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_108._8_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_108._8_8_)->super_RefCountedObject).refCount + 1;
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar5);
    uVar5 = local_128._8_8_;
    local_f8.data = this->data;
    if (local_128._M_allocated_capacity != local_128._8_8_) {
      pcVar20 = (pointer)0x3e8;
      uVar11 = local_128._M_allocated_capacity;
      do {
        pcVar4 = (((SourceCodeText *)uVar11)->filename)._M_dataplus._M_p;
        if (pcVar4 != (pointer)0x0) {
          pos = *(CodeLocation **)uVar11;
          pcVar14 = (pointer)0x0;
          do {
            if (pcVar14[(long)&((_Alloc_hider *)&((SourceCodeText *)pos)->super_RefCountedObject)->
                               _M_p] != ' ') goto LAB_001b4da3;
            pcVar14 = pcVar14 + 1;
          } while (pcVar4 != pcVar14);
        }
        pcVar14 = (pointer)0x0;
LAB_001b4da3:
        if (pcVar14 < pcVar20) {
          pcVar20 = pcVar14;
        }
        uVar11 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
      } while (uVar11 != local_128._8_8_);
      if (local_128._M_allocated_capacity != local_128._8_8_ && pcVar20 != (pointer)0x0) {
        uVar11 = local_128._M_allocated_capacity;
        do {
          std::__cxx11::string::substr((ulong)local_150,uVar11);
          pos = (CodeLocation *)local_150;
          std::__cxx11::string::operator=((string *)uVar11,(string *)local_150);
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            pos = (CodeLocation *)(local_140._0_8_ + 1);
            operator_delete((void *)local_150._0_8_,(ulong)pos);
          }
          uVar11 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
        } while (uVar11 != uVar5);
      }
    }
  }
  else {
    pSVar17 = (SourceCodeText *)this;
    UTF8Reader::find((UTF8Reader *)(local_98 + 0x20),(char *)this);
    cVar1 = *(char *)local_98._32_8_;
    if (cVar1 == '\0') {
      __return_storage_ptr__->valid = false;
      __return_storage_ptr__->isStarSlash = false;
      __return_storage_ptr__->isDoxygenStyle = false;
      __return_storage_ptr__->isReferringBackwards = false;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
      (__return_storage_ptr__->range).start.location.data = (char *)0x0;
      (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
      (__return_storage_ptr__->range).end.location.data = (char *)0x0;
      pos = (CodeLocation *)pSVar17;
    }
    else {
      local_150._0_8_ = (SourceCodeText *)local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,this->data);
      local_a8[0] = 10;
      source._M_str = local_a8;
      source._M_len = local_150._0_8_;
      choc::text::
      splitString<choc::text::splitString[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,char,bool)::_lambda(char)_1_>
                (&local_48,(text *)local_150._8_8_,source,(anon_class_1_1_b77187a0 *)0x0,
                 (bool)in_R9B);
      local_98._0_8_ = local_118._M_allocated_capacity;
      local_a8._8_8_ = local_128._8_8_;
      local_a8._0_8_ = local_128._M_allocated_capacity;
      local_128._M_allocated_capacity =
           (size_type)
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_128._8_8_ =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118._M_allocated_capacity =
           (size_type)
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
        operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
      }
      ptVar3 = (text *)(pos->location).data;
      CodeLocation::getStartOfLine((CodeLocation *)local_150);
      uVar5 = local_150._8_8_;
      uVar18 = (long)ptVar3 - local_150._8_8_;
      local_f0 = __return_storage_ptr__;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_150._0_8_);
      local_70._M_p = (pointer)local_128._8_8_;
      if (local_128._M_allocated_capacity != local_128._8_8_) {
        pSVar17 = (SourceCodeText *)(local_c0 + 8);
        uVar11 = local_128._M_allocated_capacity;
        do {
          pSVar13 = (SourceCodeText *)local_d8;
          local_c8 = pSVar17;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*(long *)uVar11,
                     (((SourceCodeText *)uVar11)->filename)._M_dataplus._M_p + *(long *)uVar11);
          for (ptVar8 = (text *)local_c0._0_8_; ptVar8 != (text *)0x0; ptVar8 = ptVar8 + -1) {
            if ((4 < (byte)(&local_c8[-1].field_0x57)[(long)ptVar8] - 9) &&
               ((&local_c8[-1].field_0x57)[(long)ptVar8] != 0x20)) {
              ptVar8[(long)&local_c8->super_RefCountedObject] = (text)0x0;
              if (local_c8 == pSVar17) {
                local_140._8_8_ = _Stack_b0._M_p;
                local_150._0_8_ = (SourceCodeText *)local_140;
              }
              else {
                local_150._0_8_ = local_c8;
              }
              local_140._0_8_ = local_c0._8_8_;
              puVar9 = (undefined8 *)local_c0;
              pSVar12 = pSVar17;
              local_150._8_8_ = ptVar8;
              local_c8 = pSVar17;
              local_c0._0_8_ = ptVar8;
              goto LAB_001b49d8;
            }
          }
          puVar9 = (undefined8 *)(local_150 + 8);
          pSVar12 = (SourceCodeText *)local_140;
          local_150._0_8_ = (SourceCodeText *)local_140;
LAB_001b49d8:
          *puVar9 = 0;
          *(undefined1 *)&((_Alloc_hider *)&pSVar12->super_RefCountedObject)->_M_p = 0;
          std::__cxx11::string::operator=((string *)uVar11,(string *)local_150);
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
          }
          if (local_c8 != pSVar17) {
            operator_delete(local_c8,local_c0._8_8_ + 1);
          }
          pcVar20 = (((SourceCodeText *)uVar11)->filename)._M_dataplus._M_p;
          pos = *(CodeLocation **)uVar11;
          local_e8 = pSVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,pos,
                     (((SourceCodeText *)uVar11)->filename)._M_dataplus._M_p +
                     (long)&((_Alloc_hider *)&((SourceCodeText *)pos)->super_RefCountedObject)->_M_p
                    );
          if (local_e0 == (text *)0x0) {
LAB_001b4a6c:
            pptVar10 = (text **)(local_150 + 8);
            pSVar13 = (SourceCodeText *)local_140;
            local_150._0_8_ = (SourceCodeText *)local_140;
          }
          else {
            bVar2 = *(byte *)&((_Alloc_hider *)&local_e8->super_RefCountedObject)->_M_p;
            pos = (CodeLocation *)local_e8;
            if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) {
              if (local_e0 != (text *)0x1) {
                pos = (CodeLocation *)
                      ((long)&((_Alloc_hider *)&local_e8->super_RefCountedObject)->_M_p + 1);
                ptVar8 = local_e0 + -1;
                do {
                  bVar2 = *(byte *)&((_Alloc_hider *)
                                    &((SourceCodeText *)pos)->super_RefCountedObject)->_M_p;
                  if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
                    local_150._0_8_ = (SourceCodeText *)local_140;
                    std::__cxx11::string::
                    _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                              ((string *)local_150,pos,
                               local_e0 + (long)&local_e8->super_RefCountedObject);
                    goto LAB_001b4a83;
                  }
                  pos = (CodeLocation *)
                        ((long)&((_Alloc_hider *)&((SourceCodeText *)pos)->super_RefCountedObject)->
                                _M_p + 1);
                  ptVar8 = ptVar8 + -1;
                } while (ptVar8 != (text *)0x0);
              }
              goto LAB_001b4a6c;
            }
            if (local_e8 == pSVar13) {
              local_140._8_8_ = local_d8._8_8_;
              local_150._0_8_ = (SourceCodeText *)local_140;
            }
            else {
              local_150._0_8_ = local_e8;
            }
            local_140._0_8_ = local_d8._0_8_;
            pptVar10 = &local_e0;
            local_150._8_8_ = local_e0;
            local_e8 = pSVar13;
          }
          *pptVar10 = (text *)0x0;
          *(undefined1 *)&((_Alloc_hider *)&pSVar13->super_RefCountedObject)->_M_p = 0;
LAB_001b4a83:
          uVar19 = local_150._8_8_;
          if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
            pos = (CodeLocation *)(local_140._0_8_ + 1);
            operator_delete((void *)local_150._0_8_,(ulong)pos);
          }
          if (local_e8 != (SourceCodeText *)local_d8) {
            pos = (CodeLocation *)(local_d8._0_8_ + 1);
            operator_delete(local_e8,(ulong)pos);
          }
          if ((ptVar3 != (text *)uVar5 && -1 < (long)uVar18) &&
             (uVar18 <= (ulong)((long)pcVar20 - uVar19))) {
            pos = (CodeLocation *)local_150;
            std::__cxx11::string::substr((ulong)pos,uVar11);
            std::__cxx11::string::operator=((string *)uVar11,(string *)pos);
            if ((SourceCodeText *)local_150._0_8_ != (SourceCodeText *)local_140) {
              pos = (CodeLocation *)(local_140._0_8_ + 1);
              operator_delete((void *)local_150._0_8_,(ulong)pos);
            }
          }
          uVar11 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
        } while ((pointer)uVar11 != local_70._M_p);
      }
      uVar5 = local_108._8_8_;
      local_108._8_8_ = *(undefined8 *)local_98._24_8_;
      if ((SourceCodeText *)local_108._8_8_ != (SourceCodeText *)0x0) {
        (((SourceCodeText *)local_108._8_8_)->super_RefCountedObject).refCount =
             (((SourceCodeText *)local_108._8_8_)->super_RefCountedObject).refCount + 1;
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar5);
      __return_storage_ptr__ = local_f0;
      local_f8.data = (char *)local_98._32_8_;
      uVar15 = 3;
      do {
        UTF8Reader::operator++(&local_f8);
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
    }
    if (cVar1 == '\0') goto LAB_001b505d;
  }
  uVar5 = local_128._8_8_;
  lVar16 = (long)(local_128._8_8_ - local_128._0_8_) >> 7;
  uVar11 = local_128._M_allocated_capacity;
  if (0 < lVar16) {
    lVar16 = lVar16 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)uVar11,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      uVar19 = uVar11;
      if (bVar6) goto LAB_001b4f72;
      uVar19 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)uVar19,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      if (bVar6) goto LAB_001b4f72;
      uVar19 = (((SourceCodeText *)uVar11)->content).field_2._M_local_buf + 8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)uVar19,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      if (bVar6) goto LAB_001b4f72;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)&((SourceCodeText *)(uVar11 + 0x58))->filename,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      uVar19 = &((SourceCodeText *)(uVar11 + 0x58))->filename;
      if (bVar6) goto LAB_001b4f72;
      uVar11 = &((SourceCodeText *)(uVar11 + 0x58))->content;
      lVar16 = lVar16 + -1;
    } while (1 < lVar16);
  }
  lVar16 = (long)(uVar5 - uVar11) >> 5;
  if (lVar16 == 1) {
LAB_001b4f61:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)uVar11,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    uVar19 = uVar11;
    if (!bVar6) {
      uVar19 = uVar5;
    }
  }
  else if (lVar16 == 2) {
LAB_001b4f51:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::operator()
                      ((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                        *)uVar11,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pos);
    uVar19 = uVar11;
    if (!bVar6) {
      uVar11 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
      goto LAB_001b4f61;
    }
  }
  else {
    uVar19 = uVar5;
    if ((lVar16 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
                operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                            *)uVar11,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )pos), uVar19 = uVar11, !bVar6)) {
      uVar11 = (((SourceCodeText *)uVar11)->filename).field_2._M_local_buf + 8;
      goto LAB_001b4f51;
    }
  }
LAB_001b4f72:
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((((SourceCodeText *)uVar19)->filename).field_2._M_local_buf + 8);
  if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5 &&
      uVar19 != uVar5) {
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::$_1>::
              operator()((_Iter_pred<soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
                          *)this_00,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )pos);
      if (!bVar6) {
        pos = (CodeLocation *)this_00;
        std::__cxx11::string::operator=((string *)uVar19,(string *)this_00);
        uVar19 = (((SourceCodeText *)uVar19)->filename).field_2._M_local_buf + 8;
      }
      this_00 = this_00 + 1;
    } while (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5);
  }
  if (uVar19 != uVar5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(iterator)uVar19,(iterator)uVar5);
  }
  while ((local_128._M_allocated_capacity != local_128._8_8_ &&
         (*(long *)(local_128._8_8_ + -0x18) == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_128._8_8_ + -0x20));
  }
  while ((local_128._M_allocated_capacity != local_128._8_8_ &&
         (*(size_type *)(local_128._M_allocated_capacity + 8) == 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_128,(iterator)local_128._M_allocated_capacity);
  }
  __return_storage_ptr__->valid = (bool)(undefined1)local_130;
  __return_storage_ptr__->isStarSlash = (bool)local_130._1_1_;
  __return_storage_ptr__->isDoxygenStyle = (bool)uStack_12e;
  __return_storage_ptr__->isReferringBackwards = (bool)uStack_12d;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._M_allocated_capacity;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118._M_allocated_capacity;
  local_118._M_allocated_capacity = 0;
  local_128._M_allocated_capacity = 0;
  local_128._8_8_ = (SourceCodeText *)0x0;
  (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)local_118._8_8_;
  local_118._8_8_ = (SourceCodeText *)0x0;
  (__return_storage_ptr__->range).start.location.data = (char *)local_108._M_allocated_capacity;
  (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)local_108._8_8_;
  local_108._8_8_ = (SourceCodeText *)0x0;
  (__return_storage_ptr__->range).end.location.data = local_f8.data;
LAB_001b505d:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_108._8_8_);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_118._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::parseComment (CodeLocation pos)
{
    if (pos.isEmpty())
        return {};

    Comment result;
    pos.location = pos.location.findEndOfWhitespace();
    result.range.start = pos;

    if (pos.location.advanceIfStartsWith ("/*"))
    {
        result.valid = true;
        result.isStarSlash = true;

        while (*pos.location == '*')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else if (pos.location.advanceIfStartsWith ("//"))
    {
        result.valid = true;
        result.isStarSlash = false;

        while (*pos.location == '/')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else
    {
        return {};
    }

    if (pos.location.advanceIfStartsWith ("<"))
        result.isReferringBackwards = true;

    while (*pos.location == ' ')
        ++(pos.location);

    if (result.isStarSlash)
    {
        auto closeComment = pos.location.find ("*/");

        if (closeComment.isEmpty())
            return {};

        result.lines = choc::text::splitIntoLines (std::string (pos.location.getAddress(),
                                                                closeComment.getAddress()),
                                                   false);

        auto firstLineIndent = pos.location.getAddress() - pos.getStartOfLine().location.getAddress();

        for (auto& l : result.lines)
        {
            l = choc::text::trimEnd (l);
            auto leadingSpacesOnLine = l.length() - choc::text::trimStart (l).length();

            if (firstLineIndent > 0 && leadingSpacesOnLine >= (size_t) firstLineIndent)
                l = l.substr ((size_t) firstLineIndent);
        }

        result.range.end = pos;
        result.range.end.location = closeComment;
        result.range.end.location += 2;
    }
    else
    {
        for (;;)
        {
            auto line = choc::text::trim (pos.getSourceLine());

            if (! choc::text::startsWith (line, "//"))
                break;

            line = line.substr (2);

            while (! line.empty() && line[0] == '/')
                line = line.substr (1);

            result.lines.push_back (line);
            pos = pos.getStartOfNextLine();
        }

        result.range.end = pos;

        if (! result.lines.empty())
        {
            auto countLeadingSpaces = [] (std::string_view s) -> size_t
            {
                for (size_t i = 0; i < s.length(); ++i)
                    if (s[i] != ' ')
                        return i;

                return 0;
            };

            size_t leastLeadingSpace = 1000;

            for (auto& l : result.lines)
                leastLeadingSpace = std::min (leastLeadingSpace, countLeadingSpaces (l));

            if (leastLeadingSpace != 0)
                for (auto& l : result.lines)
                    l = l.substr (leastLeadingSpace);
        }
    }

    removeIf (result.lines, [] (const std::string& s) { return choc::text::contains (s, "================")
                                                            || choc::text::contains (s, "****************"); });

    while (! result.lines.empty() && result.lines.back().empty())
        result.lines.erase (result.lines.end() - 1);

    while (! result.lines.empty() && result.lines.front().empty())
        result.lines.erase (result.lines.begin());

    return result;
}